

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

void __thiscall AddrManImpl::MakeTried(AddrManImpl *this,AddrInfo *info,nid_type nId)

{
  undefined8 uVar1;
  string_view source_file;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  LogFlags flag;
  mapped_type *pmVar7;
  size_type sVar8;
  mapped_type *pmVar9;
  AddrManImpl *this_00;
  long in_RDX;
  ConstevalFormatString<5U> in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000070;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000080;
  int *in_stack_00000088;
  AddrInfo *infoOld;
  int pos;
  int bucket;
  int n;
  int start_bucket;
  int nUBucketPos;
  int nUBucket;
  nid_type nIdEvict;
  int nKBucketPos;
  int nKBucket;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 uVar10;
  int in_stack_fffffffffffffecc;
  char *in_stack_fffffffffffffed0;
  AddrInfo *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffee8;
  CService *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff18;
  undefined1 fNew;
  uint256 *in_stack_ffffffffffffff20;
  AddrInfo *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff4c;
  NetGroupManager *in_stack_ffffffffffffff50;
  uint256 *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int local_98;
  long lVar11;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  string_view in_stack_ffffffffffffff90;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar11 = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
             (AnnotatedMixin<std::mutex> *)0x87ec49);
  iVar3 = AddrInfo::GetNewBucket
                    (in_stack_fffffffffffffed8,(uint256 *)in_stack_fffffffffffffed0,
                     (NetGroupManager *)
                     CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  for (local_98 = 0; fNew = (undefined1)((ulong)in_stack_ffffffffffffff18 >> 0x38), local_98 < 0x400
      ; local_98 = local_98 + 1) {
    in_stack_ffffffffffffff64 = (iVar3 + local_98) % 0x400;
    in_stack_ffffffffffffff60 =
         AddrInfo::GetBucketPosition
                   (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,(bool)fNew,
                    in_stack_ffffffffffffff4c);
    fNew = (undefined1)((ulong)in_stack_ffffffffffffff18 >> 0x38);
    if (*(long *)(in_RDI + 0x20180 + (long)in_stack_ffffffffffffff64 * 0x200 +
                 (long)in_stack_ffffffffffffff60 * 8) == in_RDX) {
      *(undefined8 *)
       (in_RDI + 0x20180 + (long)in_stack_ffffffffffffff64 * 0x200 +
       (long)in_stack_ffffffffffffff60 * 8) = 0xffffffffffffffff;
      *(int *)(in_RSI.fmt + 0x74) = *(int *)(in_RSI.fmt + 0x74) + -1;
      if (*(int *)(in_RSI.fmt + 0x74) == 0) break;
    }
  }
  *(int *)(in_RDI + 0x20178) = *(int *)(in_RDI + 0x20178) + -1;
  flag = in_RDI + (QT|LIBEVENT|ESTIMATEFEE|RPC|WALLETDB|HTTP);
  CNetAddr::GetNetwork((CNetAddr *)in_stack_fffffffffffffed0);
  pmVar7 = std::
           unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
           ::operator[]((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                         *)in_stack_fffffffffffffed8,(key_type *)in_stack_fffffffffffffed0);
  pmVar7->n_new = pmVar7->n_new - 1;
  if (*(int *)(in_RSI.fmt + 0x74) != 0) {
    __assert_fail("info.nRefCount == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                  ,0x1fd,"void AddrManImpl::MakeTried(AddrInfo &, nid_type)");
  }
  iVar3 = AddrInfo::GetTriedBucket
                    ((AddrInfo *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                     in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  iVar4 = AddrInfo::GetBucketPosition
                    (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,(bool)fNew,
                     in_stack_ffffffffffffff4c);
  if (*(long *)(in_RDI + 0x178 + (long)iVar3 * 0x200 + (long)iVar4 * 8) != -1) {
    uVar1 = *(undefined8 *)(in_RDI + 0x178 + (long)iVar3 * 0x200 + (long)iVar4 * 8);
    sVar8 = std::
            unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
            ::count((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                     *)in_stack_fffffffffffffed8,(key_type *)in_stack_fffffffffffffed0);
    if (sVar8 != 1) {
      __assert_fail("mapInfo.count(nIdEvict) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                    ,0x207,"void AddrManImpl::MakeTried(AddrInfo &, nid_type)");
    }
    pmVar9 = std::
             unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
             ::operator[]((unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                           *)in_stack_fffffffffffffed8,(key_type *)in_stack_fffffffffffffed0);
    pmVar9->fInTried = false;
    *(undefined8 *)(in_RDI + 0x178 + (long)iVar3 * 0x200 + (long)iVar4 * 8) = 0xffffffffffffffff;
    *(int *)(in_RDI + 0x170) = *(int *)(in_RDI + 0x170) + -1;
    this_00 = (AddrManImpl *)(in_RDI + 0xa01c8);
    CNetAddr::GetNetwork((CNetAddr *)in_stack_fffffffffffffed0);
    pmVar7 = std::
             unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
             ::operator[]((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                           *)in_stack_fffffffffffffed8,(key_type *)in_stack_fffffffffffffed0);
    pmVar7->n_tried = pmVar7->n_tried - 1;
    iVar5 = AddrInfo::GetNewBucket
                      (in_stack_fffffffffffffed8,(uint256 *)in_stack_fffffffffffffed0,
                       (NetGroupManager *)
                       CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    iVar6 = AddrInfo::GetBucketPosition
                      ((AddrInfo *)this_00,in_stack_ffffffffffffff20,(bool)fNew,
                       in_stack_ffffffffffffff4c);
    ClearNew(this_00,(int)((ulong)pmVar9 >> 0x20),(int)pmVar9);
    if (*(long *)(in_RDI + 0x20180 + (long)iVar5 * 0x200 + (long)iVar6 * 8) != -1) {
      __assert_fail("vvNew[nUBucket][nUBucketPos] == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                    ,0x214,"void AddrManImpl::MakeTried(AddrInfo &, nid_type)");
    }
    pmVar9->nRefCount = 1;
    *(undefined8 *)(in_RDI + 0x20180 + (long)iVar5 * 0x200 + (long)iVar6 * 8) = uVar1;
    *(int *)(in_RDI + 0x20178) = *(int *)(in_RDI + 0x20178) + 1;
    CNetAddr::GetNetwork((CNetAddr *)in_stack_fffffffffffffed0);
    pmVar7 = std::
             unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
             ::operator[]((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                           *)in_stack_fffffffffffffed8,(key_type *)in_stack_fffffffffffffed0);
    pmVar7->n_new = pmVar7->n_new + 1;
    bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),Trace)
    ;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      in_stack_fffffffffffffed0 = "Moved %s from tried[%i][%i] to new[%i][%i] to make space\n";
      in_stack_fffffffffffffed8 = (AddrInfo *)&stack0xffffffffffffffd8;
      CService::ToStringAddrPort_abi_cxx11_(in_stack_ffffffffffffff00);
      uVar10 = 1;
      source_file._M_str._0_4_ = in_stack_ffffffffffffff88;
      source_file._M_len = lVar11;
      source_file._M_str._4_4_ = in_stack_ffffffffffffff8c;
      LogPrintFormatInternal<std::__cxx11::string,int,int,int,int>
                (in_stack_ffffffffffffff90,source_file,(int)((ulong)in_RDI >> 0x20),flag,
                 in_stack_00000070,in_RSI,in_stack_00000080,in_stack_00000088,(int *)infoOld,_pos,_n
                );
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffecc,uVar10));
    }
  }
  if (*(long *)(in_RDI + 0x178 + (long)iVar3 * 0x200 + (long)iVar4 * 8) != -1) {
    __assert_fail("vvTried[nKBucket][nKBucketPos] == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                  ,0x21e,"void AddrManImpl::MakeTried(AddrInfo &, nid_type)");
  }
  *(long *)(in_RDI + (long)iVar3 * 0x200 + 0x178 + (long)iVar4 * 8) = in_RDX;
  *(int *)(in_RDI + 0x170) = *(int *)(in_RDI + 0x170) + 1;
  in_RSI.fmt[0x78] = '\x01';
  CNetAddr::GetNetwork((CNetAddr *)in_stack_fffffffffffffed0);
  pmVar7 = std::
           unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
           ::operator[]((unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
                         *)in_stack_fffffffffffffed8,(key_type *)in_stack_fffffffffffffed0);
  pmVar7->n_tried = pmVar7->n_tried + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void AddrManImpl::MakeTried(AddrInfo& info, nid_type nId)
{
    AssertLockHeld(cs);

    // remove the entry from all new buckets
    const int start_bucket{info.GetNewBucket(nKey, m_netgroupman)};
    for (int n = 0; n < ADDRMAN_NEW_BUCKET_COUNT; ++n) {
        const int bucket{(start_bucket + n) % ADDRMAN_NEW_BUCKET_COUNT};
        const int pos{info.GetBucketPosition(nKey, true, bucket)};
        if (vvNew[bucket][pos] == nId) {
            vvNew[bucket][pos] = -1;
            info.nRefCount--;
            if (info.nRefCount == 0) break;
        }
    }
    nNew--;
    m_network_counts[info.GetNetwork()].n_new--;

    assert(info.nRefCount == 0);

    // which tried bucket to move the entry to
    int nKBucket = info.GetTriedBucket(nKey, m_netgroupman);
    int nKBucketPos = info.GetBucketPosition(nKey, false, nKBucket);

    // first make space to add it (the existing tried entry there is moved to new, deleting whatever is there).
    if (vvTried[nKBucket][nKBucketPos] != -1) {
        // find an item to evict
        nid_type nIdEvict = vvTried[nKBucket][nKBucketPos];
        assert(mapInfo.count(nIdEvict) == 1);
        AddrInfo& infoOld = mapInfo[nIdEvict];

        // Remove the to-be-evicted item from the tried set.
        infoOld.fInTried = false;
        vvTried[nKBucket][nKBucketPos] = -1;
        nTried--;
        m_network_counts[infoOld.GetNetwork()].n_tried--;

        // find which new bucket it belongs to
        int nUBucket = infoOld.GetNewBucket(nKey, m_netgroupman);
        int nUBucketPos = infoOld.GetBucketPosition(nKey, true, nUBucket);
        ClearNew(nUBucket, nUBucketPos);
        assert(vvNew[nUBucket][nUBucketPos] == -1);

        // Enter it into the new set again.
        infoOld.nRefCount = 1;
        vvNew[nUBucket][nUBucketPos] = nIdEvict;
        nNew++;
        m_network_counts[infoOld.GetNetwork()].n_new++;
        LogDebug(BCLog::ADDRMAN, "Moved %s from tried[%i][%i] to new[%i][%i] to make space\n",
                 infoOld.ToStringAddrPort(), nKBucket, nKBucketPos, nUBucket, nUBucketPos);
    }
    assert(vvTried[nKBucket][nKBucketPos] == -1);

    vvTried[nKBucket][nKBucketPos] = nId;
    nTried++;
    info.fInTried = true;
    m_network_counts[info.GetNetwork()].n_tried++;
}